

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O1

void TTD::NSLogEvents::GetPropertyAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  ScriptContext *scriptContext;
  Var pvVar4;
  RecyclableObject *value;
  undefined4 *puVar5;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  if (evt->EventKind == GetPropertyActionTag) {
    pvVar4 = InflateVarInReplay(executeContext,(TTDVar)evt[1].EventTimeStamp);
    if (pvVar4 != (Var)0x0) {
      BVar3 = Js::JavascriptOperators::IsObject(pvVar4);
      if (BVar3 != 0) {
        value = Js::VarTo<Js::RecyclableObject>(pvVar4);
        if ((((((value->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr != scriptContext) {
          pvVar4 = Js::CrossSite::MarshalVar(scriptContext,value,false);
        }
        pvVar4 = Js::JavascriptOperators::OP_GetProperty(pvVar4,evt[2].EventKind,scriptContext);
        if (pvVar4 != (Var)0x0) {
          BVar3 = Js::CrossSite::NeedMarshalVar(pvVar4,scriptContext);
          if (BVar3 != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar5 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTActionEvents.cpp"
                               ,0x24f,"(res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx))"
                               ,"res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx)");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *puVar5 = 0;
          }
        }
        JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTVarAndIntegralArgumentsAction_InternalUse<1ul,1ul>,(TTD::NSLogEvents::EventKind)51>
                  (executeContext,evt,pvVar4);
        return;
      }
    }
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void GetPropertyAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTSingleVarScalarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarScalarArgumentAction, EventKind::GetPropertyActionTag>(evt);
            Js::Var var = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_OBJECT(var, ctx);

            Js::Var res = Js::JavascriptOperators::OP_GetProperty(var, GetPropertyIdItem(action), ctx);
            Assert(res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx));

            JsRTActionHandleResultForReplay<JsRTSingleVarScalarArgumentAction, EventKind::GetPropertyActionTag>(executeContext, evt, res);
        }